

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O3

RowGroup * __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::GetSegment
          (SegmentTree<duckdb::RowGroup,_true> *this,idx_t row_number)

{
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var1;
  idx_t __n;
  reference pvVar2;
  SegmentLock l;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->node_lock;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  __n = GetSegmentIndex(this,(SegmentLock *)&local_28,row_number);
  pvVar2 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::operator[](&this->nodes,__n);
  _Var1._M_head_impl =
       (pvVar2->node).super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
       _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
       super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return _Var1._M_head_impl;
}

Assistant:

T *GetSegment(idx_t row_number) {
		auto l = Lock();
		return GetSegment(l, row_number);
	}